

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O1

void __thiscall
TPZStream::Write<long,long>
          (TPZStream *this,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *vec)

{
  size_t size;
  long *plVar1;
  long *plVar2;
  _Self __tmp;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  _Rb_tree_header *p_Var5;
  int64_t nel;
  TPZManVector<long,_10> valVec;
  TPZManVector<long,_10> keyVec;
  long local_110;
  TPZManVector<long,_10> local_108;
  TPZManVector<long,_10> local_98;
  
  size = (vec->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  TPZManVector<long,_10>::TPZManVector(&local_98,size);
  TPZManVector<long,_10>::TPZManVector(&local_108,size);
  plVar2 = local_98.super_TPZVec<long>.fStore;
  plVar1 = local_108.super_TPZVec<long>.fStore;
  p_Var3 = (vec->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(vec->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar4) = *(undefined8 *)(p_Var3 + 1);
      *(_Base_ptr *)((long)plVar1 + lVar4) = p_Var3[1]._M_parent;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      lVar4 = lVar4 + 8;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  local_110 = CONCAT44(local_98.super_TPZVec<long>.fNElements._4_4_,
                       (uint)local_98.super_TPZVec<long>.fNElements);
  (*this->_vptr_TPZStream[5])(this,&local_110,1);
  if (local_110 != 0) {
    (*this->_vptr_TPZStream[5])
              (this,local_98.super_TPZVec<long>.fStore,
               (ulong)(uint)local_98.super_TPZVec<long>.fNElements);
  }
  local_110 = CONCAT44(local_108.super_TPZVec<long>.fNElements._4_4_,
                       (uint)local_108.super_TPZVec<long>.fNElements);
  (*this->_vptr_TPZStream[5])(this,&local_110,1);
  if (local_110 != 0) {
    (*this->_vptr_TPZStream[5])
              (this,local_108.super_TPZVec<long>.fStore,
               (ulong)(uint)local_108.super_TPZVec<long>.fNElements);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_108);
  TPZManVector<long,_10>::~TPZManVector(&local_98);
  return;
}

Assistant:

void Write(const std::map<T, U> &vec) {
        int64_t sz = vec.size();
        TPZManVector<T> keyVec(sz);
        TPZManVector<U> valVec(sz);
        int64_t count = 0;
        typename std::map<T, U>::const_iterator it;
        for (it = vec.begin(); it != vec.end(); it++) {
            keyVec[count] = it->first;
            valVec[count++] = it->second;
        }
        Write(keyVec);
        Write(valVec);
    }